

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugTextUnformattedWithLocateItem(char *line_begin,char *line_end)

{
  char *text_end;
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *text_end_00;
  ImVec2 IVar4;
  undefined1 auVar5 [16];
  ImGuiID id;
  ImGuiID local_84;
  ImVec2 *local_80;
  ImVec2 *local_78;
  ImGuiContext *local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ImVec2 local_48;
  undefined8 uStack_40;
  undefined8 extraout_XMM0_Qb;
  
  TextUnformatted(line_begin,line_end);
  bVar1 = IsItemHovered(0);
  if ((bVar1) && (line_begin <= line_end + -10)) {
    local_78 = &(GImGui->LastItemData).Rect.Min;
    local_48 = (GImGui->LastItemData).Rect.Min;
    uStack_40 = 0;
    local_58 = ZEXT416((uint)(local_48.y + 0.0));
    local_70 = GImGui;
    local_80 = &(GImGui->LastItemData).Rect.Max;
    text_end_00 = line_begin;
    do {
      local_84 = 0;
      if ((((*text_end_00 == '0') && ((byte)(text_end_00[1] | 0x20U) == 0x78)) &&
          (iVar2 = __isoc99_sscanf(text_end_00 + 2,"%X",&local_84), iVar2 == 1)) &&
         ((9 < (byte)(text_end_00[10] - 0x30U) &&
          ((uVar3 = (byte)text_end_00[10] - 0x41, 0x25 < uVar3 ||
           ((0x3f0000003fU >> ((ulong)uVar3 & 0x3f) & 1) == 0)))))) {
        if (text_end_00 == line_begin) {
          local_68 = ZEXT416((uint)GImGui->FontSize) << 0x20;
        }
        else {
          auVar5._0_8_ = ImFont::CalcTextSizeA
                                   (GImGui->Font,GImGui->FontSize,3.4028235e+38,-1.0,line_begin,
                                    text_end_00,(char **)0x0);
          auVar5._8_8_ = extraout_XMM0_Qb;
          local_68._4_12_ = auVar5._4_12_;
          local_68._0_4_ = (float)(int)(auVar5._0_4_ + 0.99999);
        }
        text_end = text_end_00 + 10;
        IVar4 = ImFont::CalcTextSizeA
                          (GImGui->Font,GImGui->FontSize,3.4028235e+38,-1.0,text_end_00,text_end,
                           (char **)0x0);
        (local_70->LastItemData).Rect.Min.x = local_48.x + (float)local_68._0_4_;
        (local_70->LastItemData).Rect.Min.y = (float)local_58._0_4_;
        (local_70->LastItemData).Rect.Max.x =
             (float)(int)(IVar4.x + 0.99999) + (float)local_68._0_4_ + local_48.x;
        (local_70->LastItemData).Rect.Max.y = IVar4.y + local_48.y;
        bVar1 = IsMouseHoveringRect(local_78,local_80,true);
        text_end_00 = text_end;
        if (bVar1) {
          DebugLocateItemOnHover(local_84);
        }
      }
      text_end_00 = text_end_00 + 1;
    } while (text_end_00 <= line_end + -10);
  }
  return;
}

Assistant:

void ImGui::DebugTextUnformattedWithLocateItem(const char* line_begin, const char* line_end)
{
    TextUnformatted(line_begin, line_end);
    if (!IsItemHovered())
        return;
    ImGuiContext& g = *GImGui;
    ImRect text_rect = g.LastItemData.Rect;
    for (const char* p = line_begin; p <= line_end - 10; p++)
    {
        ImGuiID id = 0;
        if (p[0] != '0' || (p[1] != 'x' && p[1] != 'X') || sscanf(p + 2, "%X", &id) != 1 || ImCharIsXdigitA(p[10]))
            continue;
        ImVec2 p0 = CalcTextSize(line_begin, p);
        ImVec2 p1 = CalcTextSize(p, p + 10);
        g.LastItemData.Rect = ImRect(text_rect.Min + ImVec2(p0.x, 0.0f), text_rect.Min + ImVec2(p0.x + p1.x, p1.y));
        if (IsMouseHoveringRect(g.LastItemData.Rect.Min, g.LastItemData.Rect.Max, true))
            DebugLocateItemOnHover(id);
        p += 10;
    }
}